

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureTestUtil.cpp
# Opt level: O0

float glu::TextureTestUtil::computeLodFromDerivates(LodMode mode,float dudx,float dudy)

{
  float fVar1;
  float y;
  float local_18;
  float p;
  float dudy_local;
  float dudx_local;
  LodMode mode_local;
  
  local_18 = 0.0;
  if (mode < LODMODE_LAST) {
    fVar1 = deFloatAbs(dudx);
    y = deFloatAbs(dudy);
    local_18 = de::max<float>(fVar1,y);
  }
  fVar1 = deFloatLog2(local_18);
  return fVar1;
}

Assistant:

float computeLodFromDerivates (LodMode mode, float dudx, float dudy)
{
	float p = 0.0f;
	switch (mode)
	{
		// \note [mika] Min and max bounds equal to exact with 1D textures
		case LODMODE_EXACT:
		case LODMODE_MIN_BOUND:
		case LODMODE_MAX_BOUND:
			p = de::max(deFloatAbs(dudx), deFloatAbs(dudy));
			break;

		default:
			DE_ASSERT(DE_FALSE);
	}

	return deFloatLog2(p);
}